

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O1

bool tinyusdz::tydra::BuildSkelHierarchy(Skeleton *skel,SkelNode *dst,string *err)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  ostream *poVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var4;
  pointer in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  pointer pPVar6;
  long lVar7;
  char *pcVar8;
  _Base_ptr *pp_Var9;
  size_type __n;
  char *pcVar10;
  double *pdVar11;
  double *pdVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  ulong uVar13;
  long lVar14;
  byte bVar15;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> joints;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> visitSet;
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> restTransforms;
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> bindTransforms;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> jointNames;
  vector<int,_std::allocator<int>_> parentJointIds;
  difference_type nroots;
  SkelNode root;
  ostringstream ss_e;
  string *in_stack_fffffffffffffbe0;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_418;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_3f8;
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> local_3c8;
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> local_3a8;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_388;
  vector<int,_std::allocator<int>_> local_368;
  undefined1 local_348 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  undefined1 local_320 [32];
  _Alloc_hider local_300;
  size_type local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  int local_2e0;
  double local_2d8;
  double local_2d0;
  double dStack_2c8;
  double local_2c0;
  double dStack_2b8;
  double local_2b0;
  double local_2a8;
  double dStack_2a0;
  double local_298;
  double dStack_290;
  double local_288;
  double local_280;
  double dStack_278;
  double local_270;
  double dStack_268;
  double local_260;
  double local_258;
  double local_250;
  double dStack_248;
  double local_240;
  double dStack_238;
  double local_230;
  double local_228;
  double dStack_220;
  double local_218;
  double dStack_210;
  double local_208;
  double local_200;
  double dStack_1f8;
  double local_1f0;
  double dStack_1e8;
  double local_1e0;
  pointer local_1d8;
  pointer pSStack_1d0;
  pointer local_1c8;
  undefined1 local_1c0 [112];
  double dStack_150;
  double local_148;
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> local_48;
  
  bVar15 = 0;
  if ((skel->joints)._attrib.has_value_ == false) {
    in_RCX = (skel->joints)._paths.
             super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (((in_RCX == (skel->joints)._paths.
                    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                    super__Vector_impl_data._M_start) && ((skel->joints)._value_empty == false)) &&
       ((skel->joints)._blocked == false)) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                 ,0x5c);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c0,"BuildSkelHierarchy",0x12);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c0,0xb89);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      pp_Var9 = &local_3f8._M_impl.super__Rb_tree_header._M_header._M_parent;
      local_3f8._M_impl._0_8_ = pp_Var9;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Skeleton.joints attrbitue is not authored: {}","");
      fmt::format<std::__cxx11::string>
                ((string *)local_320,(fmt *)&local_3f8,(string *)&skel->name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RCX);
      poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1c0,(char *)local_320._0_8_,local_320._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
        operator_delete((void *)local_320._0_8_,CONCAT71(local_320._17_7_,local_320[0x10]) + 1);
      }
      if ((_Base_ptr *)local_3f8._M_impl._0_8_ != pp_Var9) {
        operator_delete((void *)local_3f8._M_impl._0_8_,
                        (ulong)((long)&((_Rb_tree_node_base *)
                                       &(local_3f8._M_impl.super__Rb_tree_header._M_header._M_parent
                                        )->_M_color)->_M_color + 1));
      }
      if (err != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)err,local_320._0_8_);
        if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
          operator_delete((void *)local_320._0_8_,CONCAT71(local_320._17_7_,local_320[0x10]) + 1);
        }
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
      ::std::ios_base::~ios_base((ios_base *)&dStack_150);
      return false;
    }
    local_418.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_418.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_418.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
               ,0x5c);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"BuildSkelHierarchy",0x12);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c0,0xb8f);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    pcVar10 = "Failed to get Skeleton.joints attrbitue: {}";
    pcVar8 = "";
  }
  else {
    local_418.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_418.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_418.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
              (&local_418,
               (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
               &(skel->joints)._attrib.contained);
    if (local_418.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_418.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_388.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_388.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_388.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = (skel->jointNames)._attrib.has_value_;
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT71((int7)((ulong)in_RCX >> 8),bVar2);
      if (bVar2 == false) {
        if ((((skel->jointNames)._paths.
              super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (skel->jointNames)._paths.
              super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_start) || ((skel->jointNames)._value_empty != false)) ||
           ((skel->jointNames)._blocked == true)) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1c0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                     ,0x5c);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1c0,"BuildSkelHierarchy",0x12);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"():",3);
          poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c0,0xb9c);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
          local_3f8._M_impl._0_8_ = &local_3f8._M_impl.super__Rb_tree_header._M_header._M_parent;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_3f8,"Failed to get Skeleton.jointNames attrbitue: {}","");
          fmt::format<std::__cxx11::string>
                    ((string *)local_320,(fmt *)&local_3f8,(string *)&skel->name,pbVar5);
          goto LAB_003346b6;
        }
        ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::resize
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_388,
                   (long)local_418.
                         super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_418.
                         super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 5);
        if (local_418.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_418.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
            super__Vector_impl_data._M_start) {
          lVar7 = 0;
          uVar13 = 0;
          do {
            ::std::__cxx11::string::_M_assign
                      ((string *)
                       ((long)&((local_388.
                                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->str_)._M_dataplus._M_p
                       + lVar7));
            uVar13 = uVar13 + 1;
            lVar7 = lVar7 + 0x20;
          } while (uVar13 < (ulong)((long)local_418.
                                          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_418.
                                          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
LAB_0033401f:
        local_3c8.
        super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_3c8.
        super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3c8.
        super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if ((skel->restTransforms)._attrib.has_value_ == false) {
          pPVar6 = (skel->restTransforms)._paths.
                   super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (((pPVar6 == (skel->restTransforms)._paths.
                          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                          _M_impl.super__Vector_impl_data._M_start) &&
              ((skel->restTransforms)._value_empty == false)) &&
             ((skel->restTransforms)._blocked != true)) {
            local_1c0._0_8_ = 1.0;
            local_1c0._8_8_ = 0.0;
            local_1c0._16_8_ = 0.0;
            local_1c0._24_8_ = 0.0;
            local_1c0._32_8_ = 0.0;
            local_1c0._40_8_ = 1.0;
            local_1c0._48_8_ = 0.0;
            local_1c0._56_8_ = 0.0;
            local_1c0._64_8_ = 0.0;
            local_1c0._72_8_ = 0.0;
            local_1c0._80_8_ = 1.0;
            local_1c0._88_8_ = 0.0;
            local_1c0._96_8_ = 0.0;
            local_1c0._104_8_ = 0.0;
            dStack_150 = 0.0;
            local_148 = 1.0;
            ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
            _M_fill_assign(&local_3c8,
                           (long)local_418.
                                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_418.
                                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5,
                           (value_type *)local_1c0);
            goto LAB_0033407c;
          }
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1c0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                     ,0x5c);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1c0,"BuildSkelHierarchy",0x12);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"():",3);
          poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c0,0xbb2);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
          local_3f8._M_impl._0_8_ = &local_3f8._M_impl.super__Rb_tree_header._M_header._M_parent;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_3f8,"Failed to get Skeleton.restTransforms attrbitue: {}","");
          fmt::format<std::__cxx11::string>
                    ((string *)local_320,(fmt *)&local_3f8,(string *)&skel->name,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar6);
LAB_00334aff:
          poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1c0,(char *)local_320._0_8_,local_320._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
          if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
            operator_delete((void *)local_320._0_8_,CONCAT71(local_320._17_7_,local_320[0x10]) + 1);
          }
          if ((_Base_ptr *)local_3f8._M_impl._0_8_ !=
              &local_3f8._M_impl.super__Rb_tree_header._M_header._M_parent) {
            operator_delete((void *)local_3f8._M_impl._0_8_,
                            (ulong)((long)&((_Rb_tree_node_base *)
                                           &(local_3f8._M_impl.super__Rb_tree_header._M_header.
                                            _M_parent)->_M_color)->_M_color + 1));
          }
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append((char *)err,local_320._0_8_);
            if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
              operator_delete((void *)local_320._0_8_,CONCAT71(local_320._17_7_,local_320[0x10]) + 1
                             );
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
          ::std::ios_base::~ios_base((ios_base *)&dStack_150);
          bVar2 = false;
        }
        else {
          ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
          operator=(&local_3c8,
                    (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *
                    )&(skel->restTransforms)._attrib.contained);
LAB_0033407c:
          __n = (long)local_418.
                      super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_418.
                      super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                      super__Vector_impl_data._M_start >> 5;
          if (__n != (long)local_3c8.
                           super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_3c8.
                           super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 7) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                       ,0x5c);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1c0,"BuildSkelHierarchy",0x12);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"():",3);
            poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c0,0xbbd);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
            local_3f8._M_impl._0_8_ = &local_3f8._M_impl.super__Rb_tree_header._M_header._M_parent;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_3f8,
                       "Skeleton.joints.size {} must be equal to Skeleton.restTransforms.size {}: {}"
                       ,"");
            local_348._8_8_ =
                 (long)local_418.
                       super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)local_418.
                       super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
                       .super__Vector_impl_data._M_start >> 5;
            local_3a8.
            super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)((long)local_3c8.
                                 super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_3c8.
                                 super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 7);
            fmt::format<unsigned_long,unsigned_long,std::__cxx11::string>
                      ((string *)local_320,(fmt *)&local_3f8,(string *)(local_348 + 8),
                       (unsigned_long *)&local_3a8,(unsigned_long *)&skel->name,in_R9);
            goto LAB_00334aff;
          }
          local_3a8.
          super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_3a8.
          super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_3a8.
          super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if ((skel->bindTransforms)._attrib.has_value_ == false) {
            pPVar6 = (skel->bindTransforms)._paths.
                     super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            if (((pPVar6 == (skel->bindTransforms)._paths.
                            super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                            _M_impl.super__Vector_impl_data._M_start) &&
                ((skel->bindTransforms)._value_empty == false)) &&
               ((skel->bindTransforms)._blocked != true)) {
              local_1c0._0_8_ = 1.0;
              local_1c0._8_8_ = 0.0;
              local_1c0._16_8_ = 0.0;
              local_1c0._24_8_ = 0.0;
              local_1c0._32_8_ = 0.0;
              local_1c0._40_8_ = 1.0;
              local_1c0._48_8_ = 0.0;
              local_1c0._56_8_ = 0.0;
              local_1c0._64_8_ = 0.0;
              local_1c0._72_8_ = 0.0;
              local_1c0._80_8_ = 1.0;
              local_1c0._88_8_ = 0.0;
              local_1c0._96_8_ = 0.0;
              local_1c0._104_8_ = 0.0;
              dStack_150 = 0.0;
              local_148 = 1.0;
              ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
              _M_fill_assign(&local_3c8,__n,(value_type *)local_1c0);
              goto LAB_00334107;
            }
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                       ,0x5c);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1c0,"BuildSkelHierarchy",0x12);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"():",3);
            poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c0,0xbc4);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
            local_3f8._M_impl._0_8_ = &local_3f8._M_impl.super__Rb_tree_header._M_header._M_parent;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_3f8,"Failed to get Skeleton.bindTransforms attrbitue: {}",""
                      );
            fmt::format<std::__cxx11::string>
                      ((string *)local_320,(fmt *)&local_3f8,(string *)&skel->name,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar6);
LAB_00334e0f:
            poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1c0,(char *)local_320._0_8_,local_320._8_8_);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
            if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
              operator_delete((void *)local_320._0_8_,CONCAT71(local_320._17_7_,local_320[0x10]) + 1
                             );
            }
            if ((_Base_ptr *)local_3f8._M_impl._0_8_ !=
                &local_3f8._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)local_3f8._M_impl._0_8_,
                              (ulong)((long)&((_Rb_tree_node_base *)
                                             &(local_3f8._M_impl.super__Rb_tree_header._M_header.
                                              _M_parent)->_M_color)->_M_color + 1));
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::_M_append((char *)err,local_320._0_8_);
              if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
                operator_delete((void *)local_320._0_8_,
                                CONCAT71(local_320._17_7_,local_320[0x10]) + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
            ::std::ios_base::~ios_base((ios_base *)&dStack_150);
            bVar2 = false;
          }
          else {
            ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
            operator=(&local_3a8,
                      (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                       *)&(skel->bindTransforms)._attrib.contained);
LAB_00334107:
            pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)local_3a8.
                            super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_3a8.
                            super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 7);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)local_418.
                       super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)local_418.
                       super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
                       .super__Vector_impl_data._M_start >> 5) != pbVar5) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1c0,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                         ,0x5c);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1c0,"BuildSkelHierarchy",0x12);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"():",3);
              poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c0,0xbcf);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
              local_3f8._M_impl._0_8_ = &local_3f8._M_impl.super__Rb_tree_header._M_header._M_parent
              ;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_3f8,
                         "Skeleton.joints.size {} must be equal to Skeleton.bindTransforms.size {}: {}"
                         ,"");
              local_348._8_8_ =
                   (long)local_418.
                         super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_418.
                         super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 5;
              local_368.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)((long)local_3a8.
                                   super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_3a8.
                                   super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 7);
              fmt::format<unsigned_long,unsigned_long,std::__cxx11::string>
                        ((string *)local_320,(fmt *)&local_3f8,(string *)(local_348 + 8),
                         (unsigned_long *)&local_368,(unsigned_long *)&skel->name,in_R9);
              goto LAB_00334e0f;
            }
            local_368.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            local_368.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)0x0;
            local_368.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)0x0;
            bVar2 = BuildSkelTopology((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                      &local_418,&local_368,err);
            if (bVar2) {
              local_348._0_8_ = (pointer)0x0;
              pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_368.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              while (pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_368.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish) {
                local_348._0_8_ =
                     local_348._0_8_ + (ulong)(*(int *)&(pbVar1->_M_dataplus)._M_p == -1);
                pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&(pbVar1->_M_dataplus)._M_p + 4);
                pbVar1 = pbVar5;
              }
              if ((pointer)local_348._0_8_ != (pointer)0x1) {
                if ((pointer)local_348._0_8_ == (pointer)0x0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1c0,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1c0,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                             ,0x5c);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1c0,"BuildSkelHierarchy",0x12);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"():",3)
                  ;
                  poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c0,0xbdf);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
                  local_3f8._M_impl._0_8_ =
                       &local_3f8._M_impl.super__Rb_tree_header._M_header._M_parent;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_3f8,"Invalid Skel topology. No root joint found: {}",
                             "");
                  fmt::format<std::__cxx11::string>
                            ((string *)local_320,(fmt *)&local_3f8,(string *)&skel->name,pbVar5);
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1c0,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1c0,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                             ,0x5c);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1c0,"BuildSkelHierarchy",0x12);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"():",3)
                  ;
                  poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c0,0xbe6);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
                  local_3f8._M_impl._0_8_ =
                       &local_3f8._M_impl.super__Rb_tree_header._M_header._M_parent;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_3f8,
                             "Invalid Skel topology. Topology must be single-rooted, but it has {} roots: {}"
                             ,"");
                  fmt::format<long,std::__cxx11::string>
                            ((string *)local_320,(fmt *)&local_3f8,(string *)local_348,
                             (long *)&skel->name,in_R8);
                }
                poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1c0,(char *)local_320._0_8_,local_320._8_8_);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
                if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
                  operator_delete((void *)local_320._0_8_,
                                  CONCAT71(local_320._17_7_,local_320[0x10]) + 1);
                }
                if ((_Base_ptr *)local_3f8._M_impl._0_8_ !=
                    &local_3f8._M_impl.super__Rb_tree_header._M_header._M_parent) {
                  operator_delete((void *)local_3f8._M_impl._0_8_,
                                  (ulong)((long)&((_Rb_tree_node_base *)
                                                 &(local_3f8._M_impl.super__Rb_tree_header._M_header
                                                  ._M_parent)->_M_color)->_M_color + 1));
                }
                if (err != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::__cxx11::string::_M_append((char *)err,local_320._0_8_);
                  if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
                    operator_delete((void *)local_320._0_8_,
                                    CONCAT71(local_320._17_7_,local_320[0x10]) + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
                ::std::ios_base::~ios_base((ios_base *)&dStack_150);
                goto LAB_003352c9;
              }
              local_3f8._M_impl.super__Rb_tree_header._M_header._M_left =
                   &local_3f8._M_impl.super__Rb_tree_header._M_header;
              local_3f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              local_3f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_3f8._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_320._0_8_ = local_320 + 0x10;
              local_320._8_8_ = 0;
              local_320[0x10] = '\0';
              local_300._M_p = (pointer)&local_2f0;
              local_2f8 = 0;
              local_2f0._M_local_buf[0] = '\0';
              local_2e0 = -1;
              local_2d8 = 1.0;
              local_2d0 = 0.0;
              dStack_2c8 = 0.0;
              local_2c0 = 0.0;
              dStack_2b8 = 0.0;
              local_2b0 = 1.0;
              local_2a8 = 0.0;
              dStack_2a0 = 0.0;
              local_298 = 0.0;
              dStack_290 = 0.0;
              local_288 = 1.0;
              local_280 = 0.0;
              dStack_278 = 0.0;
              local_270 = 0.0;
              dStack_268 = 0.0;
              local_260 = 1.0;
              local_258 = 1.0;
              local_230 = 1.0;
              local_228 = 0.0;
              dStack_220 = 0.0;
              local_218 = 0.0;
              dStack_210 = 0.0;
              local_208 = 1.0;
              local_200 = 0.0;
              dStack_1f8 = 0.0;
              local_1f0 = 0.0;
              dStack_1e8 = 0.0;
              local_1e0 = 1.0;
              local_250 = 0.0;
              dStack_248 = 0.0;
              local_240 = 0.0;
              dStack_238 = 0.0;
              local_1d8 = (pointer)0x0;
              pSStack_1d0 = (pointer)0x0;
              local_1c8 = (pointer)0x0;
              local_1c0._0_4_ = 0xffffffff;
              local_3f8._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_3f8._M_impl.super__Rb_tree_header._M_header._M_left;
              _Var4 = ::std::
                      __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                                ();
              bVar2 = _Var4._M_current !=
                      local_368.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
              if (_Var4._M_current ==
                  local_368.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1c0,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1c0,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                           ,0x5c);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1c0,"BuildSkelHierarchy",0x12);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"():",3);
                poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c0,0xbef);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1c0,"Internal error.",0xf);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\n",1);
                if (err != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::__cxx11::string::_M_append((char *)err,local_348._8_8_);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_348._8_8_ != &local_330) {
                    operator_delete((void *)local_348._8_8_,local_330._M_allocated_capacity + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
                ::std::ios_base::~ios_base((ios_base *)&dStack_150);
              }
              else {
                uVar13 = (long)_Var4._M_current -
                         (long)local_368.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start;
                ::std::__cxx11::string::_M_assign((string *)&local_300);
                ::std::__cxx11::string::_M_assign((string *)local_320);
                local_2e0 = (int)(uVar13 >> 2);
                lVar14 = uVar13 * 0x20;
                pdVar11 = (double *)
                          ((long)local_3a8.
                                 super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar14);
                pdVar12 = &local_2d8;
                for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
                  *pdVar12 = *pdVar11;
                  pdVar11 = pdVar11 + (ulong)bVar15 * -2 + 1;
                  pdVar12 = pdVar12 + (ulong)bVar15 * -2 + 1;
                }
                pdVar11 = (double *)
                          (lVar14 + (long)local_3c8.
                                          super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                pdVar12 = &local_258;
                for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
                  *pdVar12 = *pdVar11;
                  pdVar11 = pdVar11 + (ulong)bVar15 * -2 + 1;
                  pdVar12 = pdVar12 + (ulong)bVar15 * -2 + 1;
                }
                ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                ::vector(&local_48,&local_3a8);
                detail::BuildSkelHierarchyImpl
                          ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                            *)&local_3f8,(SkelNode *)local_320,&local_368,
                           (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_418,
                           (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_388,
                           &local_48,&local_3c8,in_stack_fffffffffffffbe0);
                if (local_48.
                    super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_48.
                                  super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_48.
                                        super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_48.
                                        super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                SkelNode::operator=(dst,(SkelNode *)local_320);
              }
              SkelNode::~SkelNode((SkelNode *)local_320);
              ::std::
              _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
              ::_M_erase(&local_3f8,
                         (_Link_type)local_3f8._M_impl.super__Rb_tree_header._M_header._M_parent);
            }
            else {
LAB_003352c9:
              bVar2 = false;
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_368.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              operator_delete(local_368.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_368.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_368.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
          }
          if (local_3a8.
              super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_3a8.
                            super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_3a8.
                                  super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_3a8.
                                  super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        if (local_3c8.
            super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_3c8.
                          super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_3c8.
                                super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_3c8.
                                super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  (&local_388,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                   &(skel->jointNames)._attrib.contained);
        if ((long)local_418.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_418.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                  _M_impl.super__Vector_impl_data._M_start ==
            (long)local_388.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_388.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                  _M_impl.super__Vector_impl_data._M_start) goto LAB_0033401f;
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                   ,0x5c);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c0,"BuildSkelHierarchy",0x12);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"():",3);
        poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c0,0xba3);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        local_3f8._M_impl._0_8_ = &local_3f8._M_impl.super__Rb_tree_header._M_header._M_parent;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,
                   "Skeleton.joints.size {} must be equal to Skeleton.jointNames.size {}: {}","");
        local_348._8_8_ =
             (long)local_418.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_418.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 5;
        local_3c8.
        super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)((long)local_388.
                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_388.
                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 5);
        fmt::format<unsigned_long,unsigned_long,std::__cxx11::string>
                  ((string *)local_320,(fmt *)&local_3f8,(string *)(local_348 + 8),
                   (unsigned_long *)&local_3c8,(unsigned_long *)&skel->name,in_R9);
LAB_003346b6:
        poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1c0,(char *)local_320._0_8_,local_320._8_8_);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
          operator_delete((void *)local_320._0_8_,CONCAT71(local_320._17_7_,local_320[0x10]) + 1);
        }
        if ((_Base_ptr *)local_3f8._M_impl._0_8_ !=
            &local_3f8._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)local_3f8._M_impl._0_8_,
                          (ulong)((long)&((_Rb_tree_node_base *)
                                         &(local_3f8._M_impl.super__Rb_tree_header._M_header.
                                          _M_parent)->_M_color)->_M_color + 1));
        }
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)err,local_320._0_8_);
          if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
            operator_delete((void *)local_320._0_8_,CONCAT71(local_320._17_7_,local_320[0x10]) + 1);
          }
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
        ::std::ios_base::~ios_base((ios_base *)&dStack_150);
        bVar2 = false;
      }
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_388);
      goto LAB_00335329;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
               ,0x5c);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"BuildSkelHierarchy",0x12);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c0,0xb94);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    pcVar10 = "Skeleton.joints attrbitue is empty: {}";
    pcVar8 = "";
  }
  pp_Var9 = &local_3f8._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_3f8._M_impl._0_8_ = pp_Var9;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,pcVar10,pcVar8);
  fmt::format<std::__cxx11::string>
            ((string *)local_320,(fmt *)&local_3f8,(string *)&skel->name,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RCX);
  poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1c0,(char *)local_320._0_8_,local_320._8_8_);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
    operator_delete((void *)local_320._0_8_,CONCAT71(local_320._17_7_,local_320[0x10]) + 1);
  }
  if ((_Base_ptr *)local_3f8._M_impl._0_8_ != pp_Var9) {
    operator_delete((void *)local_3f8._M_impl._0_8_,
                    (ulong)((long)&((_Rb_tree_node_base *)
                                   &(local_3f8._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                    _M_color)->_M_color + 1));
  }
  if (err != (string *)0x0) {
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)err,local_320._0_8_);
    if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
      operator_delete((void *)local_320._0_8_,CONCAT71(local_320._17_7_,local_320[0x10]) + 1);
    }
  }
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  ::std::ios_base::~ios_base((ios_base *)&dStack_150);
  bVar2 = false;
LAB_00335329:
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
            ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_418);
  return bVar2;
}

Assistant:

bool BuildSkelHierarchy(const Skeleton &skel, SkelNode &dst, std::string *err) {
  if (!skel.joints.authored()) {
    PUSH_ERROR_AND_RETURN(fmt::format(
        "Skeleton.joints attrbitue is not authored: {}", skel.name));
  }

  std::vector<value::token> joints;
  if (!skel.joints.get_value(&joints)) {
    PUSH_ERROR_AND_RETURN(
        fmt::format("Failed to get Skeleton.joints attrbitue: {}", skel.name));
  }

  if (joints.empty()) {
    PUSH_ERROR_AND_RETURN(
        fmt::format("Skeleton.joints attrbitue is empty: {}", skel.name));
  }

  std::vector<value::token> jointNames;

  if (skel.jointNames.authored()) {
    if (!skel.jointNames.get_value(&jointNames)) {
      PUSH_ERROR_AND_RETURN(fmt::format(
          "Failed to get Skeleton.jointNames attrbitue: {}", skel.name));
    }

    if (joints.size() != jointNames.size()) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("Skeleton.joints.size {} must be equal to "
                      "Skeleton.jointNames.size {}: {}",
                      joints.size(), jointNames.size(), skel.name));
    }
  } else {
    // Use joints 
    jointNames.resize(joints.size());
    for (size_t i = 0; i < joints.size(); i++) {
      jointNames[i] = joints[i];
    }
  }


  std::vector<value::matrix4d> restTransforms;
  if (skel.restTransforms.authored()) {
    if (!skel.restTransforms.get_value(&restTransforms)) {
      PUSH_ERROR_AND_RETURN(fmt::format(
          "Failed to get Skeleton.restTransforms attrbitue: {}", skel.name));
    }
  } else {
    // TODO: Report error when `restTransforms` attribute is omitted?
    restTransforms.assign(joints.size(), value::matrix4d::identity());
  }

  if (joints.size() != restTransforms.size()) {
    PUSH_ERROR_AND_RETURN(
        fmt::format("Skeleton.joints.size {} must be equal to "
                    "Skeleton.restTransforms.size {}: {}",
                    joints.size(), restTransforms.size(), skel.name));
  }

  std::vector<value::matrix4d> bindTransforms;
  if (skel.bindTransforms.authored()) {
    if (!skel.bindTransforms.get_value(&bindTransforms)) {
      PUSH_ERROR_AND_RETURN(fmt::format(
          "Failed to get Skeleton.bindTransforms attrbitue: {}", skel.name));
    }
  } else {
    // TODO: Report error when `restTransforms` attribute is omitted?
    restTransforms.assign(joints.size(), value::matrix4d::identity());
  }

  if (joints.size() != bindTransforms.size()) {
    PUSH_ERROR_AND_RETURN(
        fmt::format("Skeleton.joints.size {} must be equal to "
                    "Skeleton.bindTransforms.size {}: {}",
                    joints.size(), bindTransforms.size(), skel.name));
  }

  // Get flattened representation of joint hierarchy with BuildSkelTopology.
  // For root node, parentJointId = -1.
  std::vector<int> parentJointIds;
  if (!BuildSkelTopology(joints, parentJointIds, err)) {
    return false;
  }

  // Just in case. Chek if topology is single-rooted.
  auto nroots = std::count_if(parentJointIds.begin(), parentJointIds.end(),
                              [](int x) { return x == -1; });

  if (nroots == 0) {
    PUSH_ERROR_AND_RETURN(fmt::format(
        "Invalid Skel topology. No root joint found: {}", skel.name));
  }

  if (nroots != 1) {
    PUSH_ERROR_AND_RETURN(
        fmt::format("Invalid Skel topology. Topology must be single-rooted, "
                    "but it has {} roots: {}",
                    nroots, skel.name));
  }

  std::set<size_t> visitSet;

  SkelNode root;

  auto it = std::find(parentJointIds.begin(), parentJointIds.end(), -1);
  if (it == parentJointIds.end()) {
    PUSH_ERROR_AND_RETURN("Internal error.");
  }
  size_t rootIdx = size_t(std::distance(parentJointIds.begin(), it));

  root.joint_name = jointNames[rootIdx].str();
  root.joint_path = joints[rootIdx].str();
  root.joint_id = int(rootIdx);
  root.bind_transform = bindTransforms[rootIdx];
  root.rest_transform = restTransforms[rootIdx];

  DCOUT("parentJointIds = " << parentJointIds);
 
  // Construct hierachy from flattened id array.
  if (!detail::BuildSkelHierarchyImpl(visitSet, root, parentJointIds, joints, jointNames,
                                      bindTransforms, restTransforms,
                                      err)) {
    return false;
  }

  dst = root;

  return true;
}